

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randtocsv.cpp
# Opt level: O3

void genrandomnumbers(bool skipheader,int total,int seed)

{
  uint uVar1;
  size_t __i;
  long lVar2;
  size_t __i_1;
  ulong uVar3;
  double dVar4;
  random_device rd;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2730;
  random_device local_13a8;
  
  std::random_device::random_device(&local_13a8);
  lVar2 = 1;
  uVar3 = 0x1571;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    local_2730._M_x[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  if (seed < 1) {
    uVar1 = std::random_device::_M_getval();
    local_2730._M_x[0] = (unsigned_long)uVar1;
    lVar2 = 1;
    uVar3 = local_2730._M_x[0];
    do {
      uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
      local_2730._M_x[lVar2] = uVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x270);
  }
  else {
    local_2730._M_x[0] = (unsigned_long)(uint)seed;
    lVar2 = 1;
    uVar3 = local_2730._M_x[0];
    do {
      uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
      local_2730._M_x[lVar2] = uVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x270);
  }
  local_2730._M_p = 0x270;
  if (!skipheader) {
    puts("\"random_no\"");
  }
  if (0 < total) {
    do {
      dVar4 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_2730);
      printf("%f\n",(double)(float)(dVar4 + 0.0));
      total = total + -1;
    } while (total != 0);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void genrandomnumbers(bool skipheader, int total, int seed)
{
	std::random_device rd;
	std::uniform_real_distribution<> dis(0, 1);
	std::mt19937 mt;
	if (seed > 0) mt.seed(seed);
	else mt.seed(rd());
	if (skipheader == false) printf("\"random_no\"\n");
	for (int i = 0; i < total; i++) {
		OASIS_FLOAT f = (OASIS_FLOAT)dis(mt);
		printf("%f\n", f);
	}
}